

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfArray.h
# Opt level: O0

void __thiscall
Imf_3_4::Array<Imf_3_4::Array2D<Imath_3_2::half>_>::resizeErase
          (Array<Imf_3_4::Array2D<Imath_3_2::half>_> *this,long size)

{
  long lVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong *puVar4;
  Array2D<Imath_3_2::half> *pAVar5;
  ulong in_RSI;
  ulong *in_RDI;
  ulong uVar6;
  Array2D<Imath_3_2::half> *tmp;
  Array2D<Imath_3_2::half> *in_stack_ffffffffffffff60;
  Array2D<Imath_3_2::half> *local_58;
  
  auVar2._8_8_ = 0;
  auVar2._0_8_ = in_RSI;
  uVar3 = SUB168(auVar2 * ZEXT816(0x18),0);
  uVar6 = uVar3 + 8;
  if (SUB168(auVar2 * ZEXT816(0x18),8) != 0 || 0xfffffffffffffff7 < uVar3) {
    uVar6 = 0xffffffffffffffff;
  }
  puVar4 = (ulong *)operator_new__(uVar6);
  *puVar4 = in_RSI;
  pAVar5 = (Array2D<Imath_3_2::half> *)(puVar4 + 1);
  if (in_RSI != 0) {
    local_58 = pAVar5;
    do {
      Array2D<Imath_3_2::half>::Array2D(local_58);
      local_58 = local_58 + 1;
    } while (local_58 != pAVar5 + in_RSI);
  }
  uVar3 = in_RDI[1];
  if (uVar3 != 0) {
    lVar1 = *(long *)(uVar3 - 8);
    for (uVar6 = uVar3 + lVar1 * 0x18; uVar3 != uVar6; uVar6 = uVar6 - 0x18) {
      Array2D<Imath_3_2::half>::~Array2D(in_stack_ffffffffffffff60);
    }
    operator_delete__((void *)(uVar3 - 8),lVar1 * 0x18 + 8);
  }
  *in_RDI = in_RSI;
  in_RDI[1] = (ulong)pAVar5;
  return;
}

Assistant:

inline void
Array<T>::resizeErase (long size)
{
    T* tmp = new T[size];
    delete[] _data;
    _size = size;
    _data = tmp;
}